

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall
AddrManImpl::Attempt_(AddrManImpl *this,CService *addr,bool fCountFailure,NodeSeconds time)

{
  long lVar1;
  AddrInfo *pAVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar2 = Find(this,addr,(int *)0x0);
  if (((pAVar2 != (AddrInfo *)0x0) &&
      ((pAVar2->m_last_try).__d.__r = (rep)time.__d.__r, fCountFailure)) &&
     ((pAVar2->m_last_count_attempt).__d.__r < (this->m_last_good).__d.__r)) {
    (pAVar2->m_last_count_attempt).__d.__r = (rep)time.__d.__r;
    pAVar2->nAttempts = pAVar2->nAttempts + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Attempt_(const CService& addr, bool fCountFailure, NodeSeconds time)
{
    AssertLockHeld(cs);

    AddrInfo* pinfo = Find(addr);

    // if not found, bail out
    if (!pinfo)
        return;

    AddrInfo& info = *pinfo;

    // update info
    info.m_last_try = time;
    if (fCountFailure && info.m_last_count_attempt < m_last_good) {
        info.m_last_count_attempt = time;
        info.nAttempts++;
    }
}